

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginInitExpr
          (BinaryReaderInterp *this,Type type,FuncDesc *func)

{
  pointer pLVar1;
  Offset OVar2;
  Result RVar3;
  Location loc;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  this->func_ = func;
  OVar2 = Istream::end(this->istream_);
  this->func_->code_offset = OVar2;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar3 = SharedValidator::BeginInitExpr(&this->validator_,&loc,type);
  if (RVar3.enum_ != Error) {
    PushLabel(this,Try,0xffffffff,0xffffffff,0xffffffff);
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginInitExpr(Type type, FuncDesc* func) {
  label_stack_.clear();
  func_ = func;
  func_->code_offset = istream_.end();
  CHECK_RESULT(validator_.BeginInitExpr(GetLocation(), type));
  // Push implicit init func label (equivalent to return).
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset);
  return Result::Ok;
}